

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void re2::ConvertLatin1ToUTF8(StringPiece *latin1,string *utf)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  uint local_24;
  int n;
  Rune r;
  int i;
  char buf [4];
  string *utf_local;
  StringPiece *latin1_local;
  
  _i = utf;
  std::__cxx11::string::clear();
  n = 0;
  while( true ) {
    iVar1 = n;
    iVar3 = StringPiece::size(latin1);
    if (iVar3 <= iVar1) break;
    bVar2 = StringPiece::operator[](latin1,n);
    local_24 = (uint)bVar2;
    runetochar((char *)&r,(Rune *)&local_24);
    std::__cxx11::string::append((char *)_i,(ulong)&r);
    n = n + 1;
  }
  return;
}

Assistant:

void ConvertLatin1ToUTF8(const StringPiece& latin1, string* utf) {
  char buf[UTFmax];

  utf->clear();
  for (int i = 0; i < latin1.size(); i++) {
    Rune r = latin1[i] & 0xFF;
    int n = runetochar(buf, &r);
    utf->append(buf, n);
  }
}